

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O2

void CheckStackTrace1(int i)

{
  string *psVar1;
  int j;
  void *ra;
  CheckOpString local_70;
  LogMessage local_68;
  
  psVar1 = google::Check_LTImpl<void_const*,void*>
                     (&expected_range[5].start,(void **)&stack0xffffffffffffff88,
                      "(&expected_range[5])->start < ra");
  if (psVar1 == (string *)0x0) {
    if (expected_range[5].end < ra) {
      printf("Adjusting range from %p..%p to %p..%p\n",expected_range[5].start);
      expected_range[5].end = ra;
    }
    expected_range[4].start = (void *)0x108754;
    expected_range[4].end = (void *)0x108763;
    psVar1 = google::Check_LTImpl<void_const*,void_const*>
                       (&expected_range[4].start,&expected_range[4].end,
                        "(&expected_range[4])->start < (&expected_range[4])->end");
    if (psVar1 == (string *)0x0) {
      for (; -1 < i; i = i + -1) {
        CheckStackTrace2(i);
      }
      return;
    }
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,199,(CheckOpString *)&stack0xffffffffffffff88);
    google::LogMessage::stream(&local_68);
  }
  else {
    local_70.str_ = psVar1;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0xc6,&local_70);
    google::LogMessage::stream(&local_68);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

static void ATTRIBUTE_NOINLINE CheckStackTrace1(int i) {
  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[5]);
  INIT_ADDRESS_RANGE(CheckStackTrace1, start, end, &expected_range[4]);
  DECLARE_ADDRESS_LABEL(start);
  for (int j = i; j >= 0; j--) {
    CheckStackTrace2(j);
  }
  DECLARE_ADDRESS_LABEL(end);
}